

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructPackDecl_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          *array_lengths)

{
  FieldDef *pFVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  StructDef *struct_def_00;
  long *plVar5;
  undefined8 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  long *plVar9;
  ulong *puVar10;
  pointer pFVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  long lVar14;
  ulong uVar15;
  unsigned_long uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  array_only_lengths;
  string name;
  FieldArrayLength tmp_array_length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  local_1a8;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  CSharpGenerator *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  Type local_a8;
  StructDef *local_88;
  pointer local_80;
  value_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_f0 = this;
  local_88 = struct_def;
  if (local_80 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pFVar1 = *local_80;
      if ((pFVar1->value).type.base_type == BASE_TYPE_ARRAY) {
        local_a8.base_type = (pFVar1->value).type.element;
        uVar3 = *(undefined4 *)&(pFVar1->value).type.struct_def;
        local_a8.struct_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.struct_def + 4);
        uVar4 = *(undefined4 *)&(pFVar1->value).type.enum_def;
        local_a8.enum_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.enum_def + 4);
        local_a8.fixed_length = (pFVar1->value).type.fixed_length;
        local_a8.element = BASE_TYPE_NONE;
        local_a8.struct_def._0_2_ = (undefined2)uVar3;
        local_a8.struct_def._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
        local_a8.enum_def._0_2_ = (undefined2)uVar4;
        local_a8.enum_def._2_2_ = (undefined2)((uint)uVar4 >> 0x10);
      }
      else {
        local_a8.base_type = (pFVar1->value).type.base_type;
        local_a8.element = (pFVar1->value).type.element;
        uVar3 = *(undefined4 *)&(pFVar1->value).type.struct_def;
        local_a8.struct_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.struct_def + 4);
        uVar12 = *(undefined8 *)((long)&(pFVar1->value).type.enum_def + 2);
        local_a8.enum_def._0_2_ =
             (undefined2)
             ((ulong)*(undefined8 *)((long)&(pFVar1->value).type.struct_def + 2) >> 0x30);
        local_a8.enum_def._2_2_ = (undefined2)uVar12;
        local_a8.enum_def._4_4_ = (undefined4)((ulong)uVar12 >> 0x10);
        local_a8.fixed_length = (uint16_t)((ulong)uVar12 >> 0x30);
        local_a8.struct_def._0_2_ = (undefined2)uVar3;
        local_a8.struct_def._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      }
      local_78.name._M_dataplus._M_p = (pointer)&local_78.name.field_2;
      pcVar2 = (pFVar1->super_Definition).name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,
                 pcVar2 + (pFVar1->super_Definition).name._M_string_length);
      local_78.length = (int)local_a8.fixed_length;
      std::
      vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      ::push_back(array_lengths,&local_78);
      struct_def_00 =
           (StructDef *)
           CONCAT44(local_a8.struct_def._4_4_,
                    CONCAT22(local_a8.struct_def._2_2_,local_a8.struct_def._0_2_));
      if (struct_def_00 == (StructDef *)0x0) {
        local_1a8.
        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.
        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.
        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar11 = (array_lengths->
                  super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((array_lengths->
            super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
            )._M_impl.super__Vector_impl_data._M_finish != pFVar11) {
          lVar14 = 0;
          uVar15 = 0;
          do {
            if (0 < *(int *)((long)&pFVar11->length + lVar14)) {
              std::
              vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ::push_back(&local_1a8,
                          (value_type *)((long)&(pFVar11->name)._M_dataplus._M_p + lVar14));
            }
            uVar15 = uVar15 + 1;
            pFVar11 = (array_lengths->
                      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar14 = lVar14 + 0x28;
          } while (uVar15 < (ulong)(((long)(array_lengths->
                                           super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pFVar11 >> 3) * -0x3333333333333333));
        }
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        local_130._M_string_length = 0;
        local_130.field_2._M_local_buf[0] = '\0';
        pFVar11 = (array_lengths->
                  super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((array_lengths->
            super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
            )._M_impl.super__Vector_impl_data._M_finish != pFVar11) {
          lVar14 = 0;
          uVar15 = 0;
          do {
            std::operator+(&local_208,"_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(pFVar11->name)._M_dataplus._M_p + lVar14));
            std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_208._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            uVar15 = uVar15 + 1;
            pFVar11 = (array_lengths->
                      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar14 = lVar14 + 0x28;
          } while (uVar15 < (ulong)(((long)(array_lengths->
                                           super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pFVar11 >> 3) * -0x3333333333333333));
        }
        std::operator+(&local_1e8,"    var ",&local_130);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_208.field_2._M_allocated_capacity = *psVar8;
          local_208.field_2._8_8_ = plVar5[3];
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar8;
          local_208._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_208._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_208._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8.
            super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1a8.
            super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::append((char *)code_ptr);
          pFVar11 = (array_lengths->
                    super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((array_lengths->
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              )._M_impl.super__Vector_impl_data._M_finish != pFVar11) {
            lVar14 = 0;
            uVar15 = 0;
            do {
              ConvertCase(&local_1e8,(string *)((long)&(pFVar11->name)._M_dataplus._M_p + lVar14),
                          kUpperCamel,kSnake);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1e8,0,(char *)0x0,0x38553a);
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              psVar8 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_208.field_2._M_allocated_capacity = *psVar8;
                local_208.field_2._8_8_ = plVar5[3];
              }
              else {
                local_208.field_2._M_allocated_capacity = *psVar8;
                local_208._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_208._M_string_length = plVar5[1];
              *plVar5 = (long)psVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_208._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              uVar15 = uVar15 + 1;
              pFVar11 = (array_lengths->
                        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar14 = lVar14 + 0x28;
            } while (uVar15 < (ulong)(((long)(array_lengths->
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pFVar11 >> 3) * -0x3333333333333333));
          }
          std::__cxx11::string::append((char *)code_ptr);
        }
        else {
          GenTypeBasic_abi_cxx11_(&local_1c8,local_f0,&local_a8,true);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x36d4db);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_1e8.field_2._M_allocated_capacity = *psVar8;
            local_1e8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_1e8.field_2._M_allocated_capacity = *psVar8;
            local_1e8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1e8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_208.field_2._M_allocated_capacity = *psVar8;
            local_208.field_2._8_8_ = plVar5[3];
          }
          else {
            local_208.field_2._M_allocated_capacity = *psVar8;
            local_208._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_208._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_208._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1a8.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar14 = 0x20;
            uVar15 = 0;
            do {
              if (uVar15 != 0) {
                std::__cxx11::string::append((char *)code_ptr);
              }
              NumToString<int>(&local_208,
                               *(int *)((long)&((local_1a8.
                                                 super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->name).
                                               _M_dataplus._M_p + lVar14));
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_208._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              uVar15 = uVar15 + 1;
              lVar14 = lVar14 + 0x28;
            } while (uVar15 < (ulong)(((long)local_1a8.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_1a8.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
          }
          std::__cxx11::string::append((char *)code_ptr);
          std::__cxx11::string::append((char *)code_ptr);
          if (local_1a8.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1a8.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar14 = 0x20;
            uVar16 = 0;
            do {
              NumToString<unsigned_long>(&local_1e8,uVar16);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1e8,0,(char *)0x0,0x36e6d6);
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              psVar8 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_208.field_2._M_allocated_capacity = *psVar8;
                local_208.field_2._8_8_ = plVar5[3];
              }
              else {
                local_208.field_2._M_allocated_capacity = *psVar8;
                local_208._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_208._M_string_length = plVar5[1];
              *plVar5 = (long)psVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_50,"for (var ",&local_208);
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_190 = &local_180;
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_180 = *plVar9;
                lStack_178 = plVar5[3];
              }
              else {
                local_180 = *plVar9;
                local_190 = (long *)*plVar5;
              }
              local_188 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_190,(ulong)local_208._M_dataplus._M_p);
              local_e8 = &local_d8;
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_d8 = *plVar9;
                lStack_d0 = plVar5[3];
              }
              else {
                local_d8 = *plVar9;
                local_e8 = (long *)*plVar5;
              }
              local_e0 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
              local_150 = &local_140;
              puVar10 = (ulong *)(plVar5 + 2);
              if ((ulong *)*plVar5 == puVar10) {
                local_140 = *puVar10;
                lStack_138 = plVar5[3];
              }
              else {
                local_140 = *puVar10;
                local_150 = (ulong *)*plVar5;
              }
              local_148 = plVar5[1];
              *plVar5 = (long)puVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              NumToString<int>(&local_110,
                               *(int *)((long)&((local_1a8.
                                                 super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->name).
                                               _M_dataplus._M_p + lVar14));
              uVar15 = 0xf;
              if (local_150 != &local_140) {
                uVar15 = local_140;
              }
              if (uVar15 < local_110._M_string_length + local_148) {
                uVar12 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  uVar12 = local_110.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar12 < local_110._M_string_length + local_148) goto LAB_001c7d6f;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_110,0,(char *)0x0,(ulong)local_150);
              }
              else {
LAB_001c7d6f:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_150,(ulong)local_110._M_dataplus._M_p);
              }
              local_170 = &local_160;
              plVar5 = puVar6 + 2;
              if ((long *)*puVar6 == plVar5) {
                local_160 = *plVar5;
                uStack_158 = puVar6[3];
              }
              else {
                local_160 = *plVar5;
                local_170 = (long *)*puVar6;
              }
              local_168 = puVar6[1];
              *puVar6 = plVar5;
              puVar6[1] = 0;
              *(undefined1 *)plVar5 = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
              local_c8 = &local_b8;
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_b8 = *plVar9;
                lStack_b0 = plVar5[3];
              }
              else {
                local_b8 = *plVar9;
                local_c8 = (long *)*plVar5;
              }
              local_c0 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_c8,(ulong)local_208._M_dataplus._M_p);
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              psVar8 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_1c8.field_2._M_allocated_capacity = *psVar8;
                local_1c8.field_2._8_8_ = plVar5[3];
              }
              else {
                local_1c8.field_2._M_allocated_capacity = *psVar8;
                local_1c8._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_1c8._M_string_length = plVar5[1];
              *plVar5 = (long)psVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              psVar8 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_1e8.field_2._M_allocated_capacity = *psVar8;
                local_1e8.field_2._8_8_ = plVar5[3];
              }
              else {
                local_1e8.field_2._M_allocated_capacity = *psVar8;
                local_1e8._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_1e8._M_string_length = plVar5[1];
              *plVar5 = (long)psVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if (local_c8 != &local_b8) {
                operator_delete(local_c8,local_b8 + 1);
              }
              if (local_170 != &local_160) {
                operator_delete(local_170,local_160 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if (local_e8 != &local_d8) {
                operator_delete(local_e8,local_d8 + 1);
              }
              if (local_190 != &local_180) {
                operator_delete(local_190,local_180 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              uVar16 = uVar16 + 1;
              lVar14 = lVar14 + 0x28;
            } while (uVar16 < (ulong)(((long)local_1a8.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_1a8.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
          }
          if (local_1a8.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1a8.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar16 = 0;
            do {
              NumToString<unsigned_long>(&local_1e8,uVar16);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1e8,0,(char *)0x0,0x36e6d6);
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              psVar8 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_208.field_2._M_allocated_capacity = *psVar8;
                local_208.field_2._8_8_ = plVar5[3];
              }
              else {
                local_208.field_2._M_allocated_capacity = *psVar8;
                local_208._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_208._M_string_length = plVar5[1];
              *plVar5 = (long)psVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if (uVar16 == 0) {
                local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1c8,local_130._M_dataplus._M_p,
                           local_130._M_dataplus._M_p + local_130._M_string_length);
                std::__cxx11::string::append((char *)&local_1c8);
                plVar5 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_1c8,(ulong)local_208._M_dataplus._M_p);
                local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                psVar8 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar8) {
                  local_1e8.field_2._M_allocated_capacity = *psVar8;
                  local_1e8.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_1e8.field_2._M_allocated_capacity = *psVar8;
                  local_1e8._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_1e8._M_string_length = plVar5[1];
                *plVar5 = (long)psVar8;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1e8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                uVar12 = local_1c8.field_2._M_allocated_capacity;
                _Var13._M_p = local_1c8._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_001c824f;
              }
              else {
                std::operator+(&local_1e8,",",&local_208);
                std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1e8._M_dataplus._M_p);
                uVar12 = local_1e8.field_2._M_allocated_capacity;
                _Var13._M_p = local_1e8._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_001c824f:
                  operator_delete(_Var13._M_p,uVar12 + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < (ulong)(((long)local_1a8.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_1a8.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
          }
          std::__cxx11::string::append((char *)code_ptr);
          pFVar11 = (array_lengths->
                    super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((array_lengths->
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              )._M_impl.super__Vector_impl_data._M_finish != pFVar11) {
            lVar14 = 0;
            uVar16 = 0;
            uVar15 = 0;
            do {
              ConvertCase(&local_1e8,(string *)((long)&(pFVar11->name)._M_dataplus._M_p + lVar14),
                          kUpperCamel,kSnake);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1e8,0,(char *)0x0,0x38553a);
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              psVar8 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_208.field_2._M_allocated_capacity = *psVar8;
                local_208.field_2._8_8_ = plVar5[3];
              }
              else {
                local_208.field_2._M_allocated_capacity = *psVar8;
                local_208._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_208._M_string_length = plVar5[1];
              *plVar5 = (long)psVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_208._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if (0 < *(int *)((long)&((array_lengths->
                                       super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->length + lVar14)
                 ) {
                NumToString<unsigned_long>(&local_1c8,uVar16);
                plVar5 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1c8,0,(char *)0x0,0x36e6d5);
                local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                psVar8 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar8) {
                  local_1e8.field_2._M_allocated_capacity = *psVar8;
                  local_1e8.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_1e8.field_2._M_allocated_capacity = *psVar8;
                  local_1e8._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_1e8._M_string_length = plVar5[1];
                *plVar5 = (long)psVar8;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
                local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
                psVar8 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar8) {
                  local_208.field_2._M_allocated_capacity = *psVar8;
                  local_208.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_208.field_2._M_allocated_capacity = *psVar8;
                  local_208._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_208._M_string_length = plVar5[1];
                *plVar5 = (long)psVar8;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_208._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != &local_208.field_2) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  local_208.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                uVar16 = uVar16 + 1;
              }
              uVar15 = uVar15 + 1;
              pFVar11 = (array_lengths->
                        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar14 = lVar14 + 0x28;
            } while (uVar15 < (ulong)(((long)(array_lengths->
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pFVar11 >> 3) * -0x3333333333333333));
          }
          std::__cxx11::string::append((char *)code_ptr);
          if (local_1a8.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1a8.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar15 = 0;
            do {
              std::__cxx11::string::append((char *)code_ptr);
              uVar15 = uVar15 + 1;
            } while (uVar15 < (ulong)(((long)local_1a8.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_1a8.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
          }
        }
        std::__cxx11::string::append((char *)code_ptr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ::~vector(&local_1a8);
      }
      else {
        GenStructPackDecl_ObjectAPI(local_f0,struct_def_00,code_ptr,array_lengths);
      }
      pFVar11 = (array_lengths->
                super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (array_lengths->
      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      )._M_impl.super__Vector_impl_data._M_finish = pFVar11 + -1;
      pcVar2 = pFVar11[-1].name._M_dataplus._M_p;
      paVar7 = &pFVar11[-1].name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar7) {
        operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
        operator_delete(local_78.name._M_dataplus._M_p,
                        local_78.name.field_2._M_allocated_capacity + 1);
      }
      local_80 = local_80 + 1;
    } while (local_80 !=
             (local_88->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenStructPackDecl_ObjectAPI(
      const StructDef &struct_def, std::string *code_ptr,
      std::vector<FieldArrayLength> &array_lengths) const {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      auto is_array = IsArray(field.value.type);
      const auto &field_type =
          is_array ? field.value.type.VectorType() : field.value.type;
      FieldArrayLength tmp_array_length = {
        field.name,
        field_type.fixed_length,
      };
      array_lengths.push_back(tmp_array_length);
      if (field_type.struct_def != nullptr) {
        GenStructPackDecl_ObjectAPI(*field_type.struct_def, code_ptr,
                                    array_lengths);
      } else {
        std::vector<FieldArrayLength> array_only_lengths;
        for (size_t i = 0; i < array_lengths.size(); ++i) {
          if (array_lengths[i].length > 0) {
            array_only_lengths.push_back(array_lengths[i]);
          }
        }
        std::string name;
        for (size_t i = 0; i < array_lengths.size(); ++i) {
          name += "_" + array_lengths[i].name;
        }
        code += "    var " + name + " = ";
        if (array_only_lengths.size() > 0) {
          code += "new " + GenTypeBasic(field_type) + "[";
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            if (i != 0) { code += ","; }
            code += NumToString(array_only_lengths[i].length);
          }
          code += "];\n";
          code += "    ";
          // initialize array
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            auto idx = "idx" + NumToString(i);
            code += "for (var " + idx + " = 0; " + idx + " < " +
                    NumToString(array_only_lengths[i].length) + "; ++" + idx +
                    ") {";
          }
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            auto idx = "idx" + NumToString(i);
            if (i == 0) {
              code += name + "[" + idx;
            } else {
              code += "," + idx;
            }
          }
          code += "] = _o";
          for (size_t i = 0, j = 0; i < array_lengths.size(); ++i) {
            code += "." + ConvertCase(array_lengths[i].name, Case::kUpperCamel);
            if (array_lengths[i].length <= 0) continue;
            code += "[idx" + NumToString(j++) + "]";
          }
          code += ";";
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            code += "}";
          }
        } else {
          code += "_o";
          for (size_t i = 0; i < array_lengths.size(); ++i) {
            code += "." + ConvertCase(array_lengths[i].name, Case::kUpperCamel);
          }
          code += ";";
        }
        code += "\n";
      }
      array_lengths.pop_back();
    }
  }